

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.h
# Opt level: O2

GradientPoint *
GradientPoint::fromHSV(GradientPoint *__return_storage_ptr__,float u,float h,float s,float v)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 in_XMM1_Db;
  uint uVar5;
  float fVar6;
  undefined4 in_XMM2_Db;
  uint uVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  
  __return_storage_ptr__->units = u;
  bVar1 = 1.0 < v || (1.0 < h || 1.0 < s);
  auVar9._4_4_ = s;
  auVar9._0_4_ = h;
  auVar9._8_4_ = in_XMM1_Db;
  auVar9._12_4_ = in_XMM2_Db;
  auVar9 = divps(auVar9,_DAT_001bf040);
  if (1.0 < v || (1.0 < h || 1.0 < s)) {
    v = v / 100.0;
  }
  uVar5 = (int)((uint)bVar1 << 0x1f) >> 0x1f;
  uVar7 = (int)((uint)bVar1 << 0x1f) >> 0x1f;
  fVar8 = (float)(~uVar5 & (uint)h | auVar9._0_4_ & uVar5);
  fVar4 = (float)(~uVar7 & (uint)s | auVar9._4_4_ & uVar7);
  __return_storage_ptr__->hsv[0] = fVar8;
  __return_storage_ptr__->hsv[1] = fVar4;
  __return_storage_ptr__->hsv[2] = v;
  fVar8 = fVar8 * 6.0;
  if ((uint)((long)(int)fVar8 % 6) < 6) {
    fVar3 = (1.0 - fVar4) * v;
    fVar10 = (1.0 - (fVar8 - (float)(int)fVar8) * fVar4) * v;
    fVar2 = (1.0 - (1.0 - (fVar8 - (float)(int)fVar8)) * fVar4) * v;
    fVar4 = fVar3;
    fVar6 = fVar3;
    switch((long)(int)fVar8 % 6 & 0xffffffff) {
    case 0:
      fVar6 = v;
      fVar10 = fVar2;
      break;
    case 1:
      fVar6 = fVar10;
      fVar10 = v;
      break;
    case 2:
      fVar4 = fVar2;
      fVar10 = v;
      break;
    case 3:
      fVar4 = v;
      break;
    case 4:
      fVar4 = v;
      fVar6 = fVar2;
      fVar10 = fVar3;
      break;
    case 5:
      fVar4 = fVar10;
      fVar6 = v;
      fVar10 = fVar3;
    }
    __return_storage_ptr__->rgb[0] = fVar6;
    __return_storage_ptr__->rgb[1] = fVar10;
    __return_storage_ptr__->rgb[2] = fVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

static const GradientPoint fromHSV(float u, float h, float s, float v) {
    GradientPoint out;
    out.units = u;

    // Rescale if max input range exceeds 1
    if (h > 1 || s > 1 || v > 1) {
      h /= 360;
      s /= 100;
      v /= 100;
    }

    out.hsv[0] = h;
    out.hsv[1] = s;
    out.hsv[2] = v;

    // Perform HSV->RGB conversion
    int i = (int) (h * 6);
    float f = h * 6 - i;
    float p = v * (1 - s);
    float q = v * (1 - f * s);
    float t = v * (1 - (1 - f) * s);

    switch (i % 6) {
      case 0: out.rgb[0] = v; out.rgb[1] = t; out.rgb[2] = p; break;
      case 1: out.rgb[0] = q; out.rgb[1] = v; out.rgb[2] = p; break;
      case 2: out.rgb[0] = p; out.rgb[1] = v; out.rgb[2] = t; break;
      case 3: out.rgb[0] = p; out.rgb[1] = q; out.rgb[2] = v; break;
      case 4: out.rgb[0] = t; out.rgb[1] = p; out.rgb[2] = v; break;
      case 5: out.rgb[0] = v; out.rgb[1] = p; out.rgb[2] = q; break;
    }

    return out;
  }